

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::conditionalizeExpensiveOnBitwise
          (OptimizeInstructions *this,Binary *binary)

{
  size_t sVar1;
  Expression *condition;
  PassRunner *pPVar2;
  uint *puVar3;
  Module *wasm;
  Const *pCVar4;
  bool bVar5;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  undefined1 local_390 [12];
  Literal local_380;
  undefined1 local_360 [12];
  Literal local_350;
  Builder local_338;
  Builder builder;
  uint local_328;
  CostAnalyzer local_324;
  CostType rightCost;
  CostAnalyzer local_31c;
  CostType leftCost;
  undefined4 local_314;
  undefined1 local_30e;
  byte local_30d;
  bool rightHasSideEffects;
  bool leftHasSideEffects;
  undefined1 local_300 [8];
  EffectAnalyzer rightEffects;
  EffectAnalyzer leftEffects;
  Expression *right;
  Expression *left;
  PassOptions *pPStack_28;
  int MIN_COST;
  PassOptions *options;
  Binary *binary_local;
  OptimizeInstructions *this_local;
  
  options = (PassOptions *)binary;
  binary_local = (Binary *)this;
  pPVar2 = Pass::getPassRunner((Pass *)this);
  pPStack_28 = &pPVar2->options;
  if (((pPVar2->options).optimizeLevel < 2) || (0 < (pPVar2->options).shrinkLevel)) {
    return (Expression *)(OptimizeInstructions *)0x0;
  }
  left._4_4_ = 7;
  bVar5 = true;
  if ((options->inlining).oneCallerInlineMaxSize != 7) {
    bVar5 = (options->inlining).oneCallerInlineMaxSize == 8;
  }
  if (!bVar5) {
    __assert_fail("binary->op == AndInt32 || binary->op == OrInt32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xd6c,
                  "Expression *wasm::OptimizeInstructions::conditionalizeExpensiveOnBitwise(Binary *)"
                 );
  }
  bVar5 = Expression::is<wasm::Const>(*(Expression **)&options->ignoreImplicitTraps);
  if (bVar5) {
    return (Expression *)(OptimizeInstructions *)0x0;
  }
  right = *(Expression **)&(options->inlining).allowFunctionsWithLoops;
  leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ =
       options->ignoreImplicitTraps;
  leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ =
       options->trapsNeverHappen;
  leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._2_1_ =
       options->lowMemoryUnused;
  leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ =
       options->fastMath;
  leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ =
       options->zeroFilledMemory;
  leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ =
       options->closedWorld;
  leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ =
       options->debugInfo;
  leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
       options->generateStackIR;
  bVar5 = Properties::emitsBoolean(right);
  if ((!bVar5) ||
     (bVar5 = Properties::emitsBoolean
                        ((Expression *)
                         leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                         _M_node_count), !bVar5)) {
    return (Expression *)(OptimizeInstructions *)0x0;
  }
  effects((EffectAnalyzer *)
          &rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,this,right)
  ;
  effects((EffectAnalyzer *)local_300,this,
          (Expression *)leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
         );
  local_30d = EffectAnalyzer::hasSideEffects
                        ((EffectAnalyzer *)
                         &rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
  local_30e = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)local_300);
  if (((local_30d & 1) != 0) && ((bool)local_30e)) {
    this_local = (OptimizeInstructions *)0x0;
    goto LAB_01f8b312;
  }
  if ((bool)local_30e) {
    CostAnalyzer::CostAnalyzer((CostAnalyzer *)&leftCost,right);
    if (leftCost < 7) {
      this_local = (OptimizeInstructions *)0x0;
      goto LAB_01f8b312;
    }
    bVar5 = EffectAnalyzer::invalidates
                      ((EffectAnalyzer *)
                       &rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count,(EffectAnalyzer *)local_300);
    if (bVar5) {
      this_local = (OptimizeInstructions *)0x0;
      goto LAB_01f8b312;
    }
    std::swap<wasm::Expression*>
              (&right,(Expression **)
                      &leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
  }
  else if ((local_30d & 1) == 0) {
    CostAnalyzer::CostAnalyzer(&local_324,right);
    rightCost = local_324.cost;
    CostAnalyzer::CostAnalyzer
              ((CostAnalyzer *)((long)&builder.wasm + 4),
               (Expression *)
               leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_328 = builder.wasm._4_4_;
    puVar3 = std::max<unsigned_int>(&rightCost,&local_328);
    if (*puVar3 < 7) {
      this_local = (OptimizeInstructions *)0x0;
      goto LAB_01f8b312;
    }
    if (local_328 < rightCost) {
      std::swap<wasm::Expression*>
                (&right,(Expression **)
                        &leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                         _M_node_count);
    }
  }
  else {
    CostAnalyzer::CostAnalyzer
              (&local_31c,
               (Expression *)
               leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (local_31c.cost < 7) {
      this_local = (OptimizeInstructions *)0x0;
      goto LAB_01f8b312;
    }
  }
  wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
         getModule(&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                    ).
                    super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    .
                    super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  );
  Builder::Builder(&local_338,wasm);
  condition = right;
  sVar1 = leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((options->inlining).oneCallerInlineMaxSize == 8) {
    wasm::Literal::Literal(&local_350,1);
    pCVar4 = Builder::makeConst(&local_338,&local_350);
    sVar1 = leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_360);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)local_360._0_8_;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_360[8];
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_360._9_3_;
    this_local = (OptimizeInstructions *)
                 Builder::makeIf(&local_338,condition,(Expression *)pCVar4,(Expression *)sVar1,type)
    ;
    wasm::Literal::~Literal(&local_350);
  }
  else {
    wasm::Literal::Literal(&local_380,0);
    pCVar4 = Builder::makeConst(&local_338,&local_380);
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_390);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)local_390._0_8_;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_390[8];
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_390._9_3_;
    this_local = (OptimizeInstructions *)
                 Builder::makeIf(&local_338,condition,(Expression *)sVar1,(Expression *)pCVar4,
                                 type_00);
    wasm::Literal::~Literal(&local_380);
  }
LAB_01f8b312:
  local_314 = 1;
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_300);
  EffectAnalyzer::~EffectAnalyzer
            ((EffectAnalyzer *)
             &rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return (Expression *)this_local;
}

Assistant:

Expression* conditionalizeExpensiveOnBitwise(Binary* binary) {
    // this operation can increase code size, so don't always do it
    auto& options = getPassRunner()->options;
    if (options.optimizeLevel < 2 || options.shrinkLevel > 0) {
      return nullptr;
    }
    const auto MIN_COST = 7;
    assert(binary->op == AndInt32 || binary->op == OrInt32);
    if (binary->right->is<Const>()) {
      return nullptr; // trivial
    }
    // bitwise logical operator on two non-numerical values, check if they are
    // boolean
    auto* left = binary->left;
    auto* right = binary->right;
    if (!Properties::emitsBoolean(left) || !Properties::emitsBoolean(right)) {
      return nullptr;
    }
    auto leftEffects = effects(left);
    auto rightEffects = effects(right);
    auto leftHasSideEffects = leftEffects.hasSideEffects();
    auto rightHasSideEffects = rightEffects.hasSideEffects();
    if (leftHasSideEffects && rightHasSideEffects) {
      return nullptr; // both must execute
    }
    // canonicalize with side effects, if any, happening on the left
    if (rightHasSideEffects) {
      if (CostAnalyzer(left).cost < MIN_COST) {
        return nullptr; // avoidable code is too cheap
      }
      if (leftEffects.invalidates(rightEffects)) {
        return nullptr; // cannot reorder
      }
      std::swap(left, right);
    } else if (leftHasSideEffects) {
      if (CostAnalyzer(right).cost < MIN_COST) {
        return nullptr; // avoidable code is too cheap
      }
    } else {
      // no side effects, reorder based on cost estimation
      auto leftCost = CostAnalyzer(left).cost;
      auto rightCost = CostAnalyzer(right).cost;
      if (std::max(leftCost, rightCost) < MIN_COST) {
        return nullptr; // avoidable code is too cheap
      }
      // canonicalize with expensive code on the right
      if (leftCost > rightCost) {
        std::swap(left, right);
      }
    }
    // worth it! perform conditionalization
    Builder builder(*getModule());
    if (binary->op == OrInt32) {
      return builder.makeIf(
        left, builder.makeConst(Literal(int32_t(1))), right);
    } else { // &
      return builder.makeIf(
        left, right, builder.makeConst(Literal(int32_t(0))));
    }
  }